

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer::operator()
          (dec_writer *this,wchar_t **it)

{
  int iVar1;
  bool bVar2;
  wchar_t *pwVar3;
  byte bVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  char acStack_28 [40];
  
  uVar5 = *(ulong *)this;
  iVar1 = *(int *)(this + 8);
  pcVar6 = acStack_28 + iVar1;
  uVar7 = uVar5;
  if (99 < uVar5) {
    do {
      uVar5 = uVar7 / 100;
      *(undefined2 *)(pcVar6 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar7 + (int)uVar5 * -100) * 2)
      ;
      pcVar6 = pcVar6 + -2;
      bVar2 = 9999 < uVar7;
      uVar7 = uVar5;
    } while (bVar2);
  }
  pwVar3 = *it;
  if (uVar5 < 10) {
    bVar4 = (byte)uVar5 | 0x30;
    lVar8 = -1;
  }
  else {
    pcVar6[-1] = internal::basic_data<void>::DIGITS[(uVar5 * 2 & 0xffffffff) + 1];
    bVar4 = internal::basic_data<void>::DIGITS[uVar5 * 2 & 0x1fffffffe];
    lVar8 = -2;
  }
  pcVar6[lVar8] = bVar4;
  if (0 < iVar1) {
    lVar8 = 0;
    do {
      *pwVar3 = (int)acStack_28[lVar8];
      pwVar3 = pwVar3 + 1;
      lVar8 = lVar8 + 1;
    } while (iVar1 != lVar8);
  }
  *it = pwVar3;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }